

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O3

RunResult __thiscall
wabt::interp::Thread::
DoSimdIsTrue<wabt::interp::Simd<unsigned_char,(unsigned_char)16>,(unsigned_char)16>(Thread *this)

{
  long lVar1;
  long lVar2;
  long lVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  Simd<unsigned_char,_(unsigned_char)__x10_> val;
  anon_union_16_6_113bff37_for_Value_0 local_18;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  
  local_18.v128_.v = (v128)Pop(this);
  lVar1 = 0;
  lVar2 = 0;
  lVar3 = 0;
  do {
    auVar4[0] = -((char)*(undefined2 *)((long)&local_18 + lVar1) == '\0');
    auVar4[1] = -((char)((ushort)*(undefined2 *)((long)&local_18 + lVar1) >> 8) == '\0');
    auVar4[2] = 0xff;
    auVar4[3] = 0xff;
    auVar4[4] = 0xff;
    auVar4[5] = 0xff;
    auVar4[6] = 0xff;
    auVar4[7] = 0xff;
    auVar4[8] = 0xff;
    auVar4[9] = 0xff;
    auVar4[10] = 0xff;
    auVar4[0xb] = 0xff;
    auVar4[0xc] = 0xff;
    auVar4[0xd] = 0xff;
    auVar4[0xe] = 0xff;
    auVar4[0xf] = 0xff;
    auVar13._8_4_ = 0xffffffff;
    auVar13._0_8_ = 0xffffffffffffffff;
    auVar13._12_4_ = 0xffffffff;
    auVar4 = auVar4 ^ auVar13;
    auVar12._0_14_ = auVar4._0_14_;
    auVar12[0xe] = auVar4[7];
    auVar12[0xf] = auVar4[7];
    auVar11._14_2_ = auVar12._14_2_;
    auVar11._0_13_ = auVar4._0_13_;
    auVar11[0xd] = auVar4[6];
    auVar10._13_3_ = auVar11._13_3_;
    auVar10._0_12_ = auVar4._0_12_;
    auVar10[0xc] = auVar4[6];
    auVar9._12_4_ = auVar10._12_4_;
    auVar9._0_11_ = auVar4._0_11_;
    auVar9[0xb] = auVar4[5];
    auVar8._11_5_ = auVar9._11_5_;
    auVar8._0_10_ = auVar4._0_10_;
    auVar8[10] = auVar4[5];
    auVar7._10_6_ = auVar8._10_6_;
    auVar7._0_9_ = auVar4._0_9_;
    auVar7[9] = auVar4[4];
    auVar6._9_7_ = auVar7._9_7_;
    auVar6._0_8_ = auVar4._0_8_;
    auVar6[8] = auVar4[4];
    auVar5._8_8_ = auVar6._8_8_;
    auVar5[7] = auVar4[3];
    auVar5[6] = auVar4[3];
    auVar5[5] = auVar4[2];
    auVar5[4] = auVar4[2];
    auVar5[3] = auVar4[1];
    auVar5[2] = auVar4[1];
    auVar5[0] = auVar4[0];
    auVar5[1] = auVar5[0];
    auVar13 = pshuflw(auVar5,auVar5,0xd4);
    auVar14._12_4_ = auVar13._12_4_;
    auVar14._0_8_ = auVar13._0_8_;
    auVar14._8_4_ = auVar13._4_4_;
    lVar2 = lVar2 + SUB168(auVar14 & _DAT_001fc2f0,0);
    lVar3 = lVar3 + SUB168(auVar14 & _DAT_001fc2f0,8);
    lVar1 = lVar1 + 2;
  } while (lVar1 != 0x10);
  Push(this,(Value)ZEXT116(0xf < (ulong)(lVar3 + lVar2)));
  return Ok;
}

Assistant:

RunResult Thread::DoSimdIsTrue() {
  using L = typename S::LaneType;
  auto val = Pop<S>();
  Push(std::count_if(std::begin(val.v), std::end(val.v),
                     [](L x) { return x != 0; }) >= count);
  return RunResult::Ok;
}